

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_image.cpp
# Opt level: O2

void load_image_block(astcenc_profile decode_mode,astcenc_image *img,image_block *blk,
                     block_size_descriptor *bsd,uint xpos,uint ypos,uint zpos,astcenc_swizzle *swz)

{
  uint uVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  code *pcVar6;
  uint uVar7;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  code *pcVar13;
  code *pcVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  undefined8 uVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  byte local_100;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined8 local_58;
  undefined1 extraout_var [56];
  
  uVar1 = img->dim_x;
  uVar11 = img->dim_y;
  uVar16 = img->dim_z;
  blk->xpos = xpos;
  blk->ypos = ypos;
  blk->zpos = zpos;
  auVar30 = vpcmpeqd_avx((undefined1  [16])*swz,_DAT_002f8df0);
  uVar5 = vmovmskps_avx(auVar30);
  pcVar14 = swz_texel_skip;
  if ((uVar5 & 8) == 0) {
    pcVar14 = swz_texel;
  }
  if ((uVar5 & 4) == 0) {
    pcVar14 = swz_texel;
  }
  if ((uVar5 & 2) == 0) {
    pcVar14 = swz_texel;
  }
  if ((uVar5 & 1) == 0) {
    pcVar14 = swz_texel;
  }
  auVar30 = vpinsrd_avx(ZEXT416(decode_mode & ~ASTCENC_PRF_LDR),decode_mode,1);
  auVar30 = vpcmpeqd_avx(auVar30,_DAT_003154e0);
  auVar3 = vpmovsxdq_avx(auVar30);
  uVar8 = vpextrq_avx(auVar3,1);
  local_100 = auVar30[0] & 1;
  pcVar13 = load_texel_u8;
  if (img->data_type == ASTCENC_TYPE_F32) {
    pcVar13 = load_texel_f32;
  }
  pcVar6 = load_texel_f16;
  if (img->data_type != ASTCENC_TYPE_F16) {
    pcVar6 = pcVar13;
  }
  auVar3 = vpshufd_avx(auVar30,0x40);
  pcVar13 = encode_texel_lns;
  if ((((auVar3 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar3 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar3 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar3[0xf]) {
    pcVar13 = encode_texel_unorm;
  }
  fVar19 = 1.0 / (float)bsd->texel_count;
  uVar16 = uVar16 - 1;
  uVar11 = uVar11 - 1;
  local_f8._8_4_ = 0x7e967699;
  local_f8._0_8_ = 0x7e9676997e967699;
  local_f8._12_4_ = 0x7e967699;
  local_e8 = 0;
  uStack_e0 = 0;
  local_d8._8_4_ = 0xfe967699;
  local_d8._0_8_ = 0xfe967699fe967699;
  local_d8._12_4_ = 0xfe967699;
  local_c8 = vpcmpeqd_avx(local_d8,local_d8);
  uVar15 = uVar1 - 1;
  iVar9 = 0;
  for (uVar5 = 0; uVar5 < bsd->zdim; uVar5 = uVar5 + 1) {
    uVar7 = zpos + uVar5;
    if (uVar16 <= zpos + uVar5) {
      uVar7 = uVar16;
    }
    pvVar2 = img->data[uVar7];
    for (uVar7 = 0; uVar7 < bsd->ydim; uVar7 = uVar7 + 1) {
      uVar10 = uVar7 + ypos;
      if (uVar11 <= uVar7 + ypos) {
        uVar10 = uVar11;
      }
      for (lVar18 = 0; uVar17 = (uint)lVar18, uVar17 < bsd->xdim; lVar18 = lVar18 + 1) {
        uVar12 = xpos + uVar17;
        if (uVar15 <= xpos + uVar17) {
          uVar12 = uVar15;
        }
        (*pcVar6)(pvVar2,(uVar12 + uVar10 * uVar1) * 4);
        uVar21 = (*pcVar14)(swz);
        local_58 = auVar3._0_8_;
        auVar22._0_8_ = (*pcVar13)(uVar21,local_58);
        auVar22._8_56_ = extraout_var;
        auVar25 = auVar22._0_16_;
        local_f8 = vminps_avx(local_f8,auVar25);
        fVar20 = (float)auVar22._0_8_;
        local_e8 = CONCAT44(local_e8._4_4_ + (float)((ulong)auVar22._0_8_ >> 0x20) * fVar19,
                            (float)local_e8 + fVar20 * fVar19);
        uStack_e0 = CONCAT44(uStack_e0._4_4_ + extraout_var._4_4_ * fVar19,
                             (float)uStack_e0 + extraout_var._0_4_ * fVar19);
        local_d8 = vmaxps_avx(local_d8,auVar25);
        auVar23._4_4_ = fVar20;
        auVar23._0_4_ = fVar20;
        auVar23._8_4_ = fVar20;
        auVar23._12_4_ = fVar20;
        blk->data_r[iVar9 + lVar18] = fVar20;
        fVar20 = (float)vextractps_avx(auVar25,1);
        blk->data_g[iVar9 + lVar18] = fVar20;
        auVar4 = vshufps_avx(auVar25,auVar25,0xa5);
        fVar20 = (float)vextractps_avx(auVar25,2);
        blk->data_b[iVar9 + lVar18] = fVar20;
        auVar4 = vcmpps_avx(auVar23,auVar4,0);
        fVar20 = (float)vextractps_avx(auVar25,3);
        blk->data_a[iVar9 + lVar18] = fVar20;
        local_c8 = vandps_avx(auVar4,local_c8);
        blk->rgb_lns[lVar18 + iVar9] = local_100;
        blk->alpha_lns[lVar18 + iVar9] = (byte)uVar8 & 1;
      }
      iVar9 = iVar9 + uVar17;
    }
  }
  auVar4 = vinsertps_avx(*(undefined1 (*) [16])blk->data_r,ZEXT416((uint)blk->data_g[0]),0x10);
  auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)blk->data_b[0]),0x20);
  auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)blk->data_a[0]),0x30);
  auVar25 = ZEXT816(0) << 0x40;
  if ((auVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    auVar24._0_4_ = (int)auVar4._0_4_;
    auVar24._4_4_ = (int)auVar4._4_4_;
    auVar24._8_4_ = (int)auVar4._8_4_;
    auVar24._12_4_ = (int)auVar4._12_4_;
    auVar30._8_4_ = 0x7ff;
    auVar30._0_8_ = 0x7ff000007ff;
    auVar30._12_4_ = 0x7ff;
    auVar25 = vpand_avx(auVar24,auVar30);
    auVar26._8_4_ = 3;
    auVar26._0_8_ = 0x300000003;
    auVar26._12_4_ = 3;
    auVar27 = vpmaddwd_avx(auVar25,auVar26);
    auVar29._8_4_ = 0x1ff;
    auVar29._0_8_ = 0x1ff000001ff;
    auVar29._12_4_ = 0x1ff;
    auVar26 = vpcmpgtd_avx(auVar25,auVar29);
    auVar30 = vpslld_avx(auVar25,2);
    auVar31._8_4_ = 0xfffffe00;
    auVar31._0_8_ = 0xfffffe00fffffe00;
    auVar31._12_4_ = 0xfffffe00;
    auVar32._8_4_ = 0x5ff;
    auVar32._0_8_ = 0x5ff000005ff;
    auVar32._12_4_ = 0x5ff;
    auVar30 = vpaddd_avx(auVar30,auVar31);
    auVar28 = vpcmpgtd_avx(auVar25,auVar32);
    auVar33._8_2_ = 5;
    auVar33._0_8_ = 0x5000500050005;
    auVar33._10_2_ = 5;
    auVar33._12_2_ = 5;
    auVar33._14_2_ = 5;
    auVar25 = vpmaddwd_avx(auVar25,auVar33);
    auVar34._8_4_ = 0xfffff800;
    auVar34._0_8_ = 0xfffff800fffff800;
    auVar34._12_4_ = 0xfffff800;
    auVar25 = vpaddd_avx(auVar25,auVar34);
    auVar30 = vblendvps_avx(auVar30,auVar25,auVar28);
    auVar30 = vblendvps_avx(auVar27,auVar30,auVar26);
    auVar25 = vpsrld_avx(auVar24,1);
    auVar28._8_4_ = 0x7ffffc00;
    auVar28._0_8_ = 0x7ffffc007ffffc00;
    auVar28._12_4_ = 0x7ffffc00;
    auVar26 = vpsrld_avx(auVar30,3);
    auVar30 = vpand_avx(auVar25,auVar28);
    auVar25._8_4_ = 0x7bff;
    auVar25._0_8_ = 0x7bff00007bff;
    auVar25._12_4_ = 0x7bff;
    auVar30 = vpor_avx(auVar26,auVar30);
    auVar30 = vpminud_avx(auVar30,auVar25);
    auVar30 = vpackssdw_avx(auVar30,auVar30);
    auVar25 = vcvtph2ps_f16c(auVar30);
  }
  auVar27._8_4_ = 0x477fff00;
  auVar27._0_8_ = 0x477fff00477fff00;
  auVar27._12_4_ = 0x477fff00;
  auVar30 = vdivps_avx(auVar4,auVar27);
  auVar30 = vblendvps_avx(auVar30,auVar25,auVar3);
  *(undefined1 (*) [16])(blk->origin_texel).m = auVar30;
  *(undefined8 *)(blk->data_min).m = local_f8._0_8_;
  *(undefined8 *)((blk->data_min).m + 2) = local_f8._8_8_;
  *(undefined8 *)(blk->data_mean).m = local_e8;
  *(undefined8 *)((blk->data_mean).m + 2) = uStack_e0;
  *(undefined1 (*) [16])(blk->data_max).m = local_d8;
  auVar30 = vpcmpeqd_avx(local_d8,local_d8);
  auVar30 = auVar30 & ~local_c8;
  blk->grayscale =
       (((auVar30 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        (auVar30 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar30 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar30[0xf];
  return;
}

Assistant:

void load_image_block(
	astcenc_profile decode_mode,
	const astcenc_image& img,
	image_block& blk,
	const block_size_descriptor& bsd,
	unsigned int xpos,
	unsigned int ypos,
	unsigned int zpos,
	const astcenc_swizzle& swz
) {
	unsigned int xsize = img.dim_x;
	unsigned int ysize = img.dim_y;
	unsigned int zsize = img.dim_z;

	blk.xpos = xpos;
	blk.ypos = ypos;
	blk.zpos = zpos;

	// True if any non-identity swizzle
	bool needs_swz = (swz.r != ASTCENC_SWZ_R) || (swz.g != ASTCENC_SWZ_G) ||
	                 (swz.b != ASTCENC_SWZ_B) || (swz.a != ASTCENC_SWZ_A);

	int idx = 0;

	vfloat4 data_min(1e38f);
	vfloat4 data_mean(0.0f);
	vfloat4 data_mean_scale(1.0f / static_cast<float>(bsd.texel_count));
	vfloat4 data_max(-1e38f);
	vmask4 grayscalev(true);

	// This works because we impose the same choice everywhere during encode
	uint8_t rgb_lns = (decode_mode == ASTCENC_PRF_HDR) ||
	                  (decode_mode == ASTCENC_PRF_HDR_RGB_LDR_A) ? 1 : 0;
	uint8_t a_lns = decode_mode == ASTCENC_PRF_HDR ? 1 : 0;
	vint4 use_lns(rgb_lns, rgb_lns, rgb_lns, a_lns);
	vmask4 lns_mask = use_lns != vint4::zero();

	// Set up the function pointers for loading pipeline as needed
	pixel_loader loader = load_texel_u8;
	if (img.data_type == ASTCENC_TYPE_F16)
	{
		loader = load_texel_f16;
	}
	else if  (img.data_type == ASTCENC_TYPE_F32)
	{
		loader = load_texel_f32;
	}

	pixel_swizzler swizzler = swz_texel_skip;
	if (needs_swz)
	{
		swizzler = swz_texel;
	}

	pixel_converter converter = encode_texel_unorm;
	if (any(lns_mask))
	{
		converter = encode_texel_lns;
	}

	for (unsigned int z = 0; z < bsd.zdim; z++)
	{
		unsigned int zi = astc::min(zpos + z, zsize - 1);
		void* plane = img.data[zi];

		for (unsigned int y = 0; y < bsd.ydim; y++)
		{
			unsigned int yi = astc::min(ypos + y, ysize - 1);

			for (unsigned int x = 0; x < bsd.xdim; x++)
			{
				unsigned int xi = astc::min(xpos + x, xsize - 1);

				vfloat4 datav = loader(plane, (4 * xsize * yi) + (4 * xi));
				datav = swizzler(datav, swz);
				datav = converter(datav, lns_mask);

				// Compute block metadata
				data_min = min(data_min, datav);
				data_mean += datav * data_mean_scale;
				data_max = max(data_max, datav);

				grayscalev = grayscalev & (datav.swz<0,0,0,0>() == datav.swz<1,1,2,2>());

				blk.data_r[idx] = datav.lane<0>();
				blk.data_g[idx] = datav.lane<1>();
				blk.data_b[idx] = datav.lane<2>();
				blk.data_a[idx] = datav.lane<3>();

				blk.rgb_lns[idx] = rgb_lns;
				blk.alpha_lns[idx] = a_lns;

				idx++;
			}
		}
	}

	// Reverse the encoding so we store origin block in the original format
	vfloat4 data_enc = blk.texel(0);
	vfloat4 data_enc_unorm = data_enc / 65535.0f;
	vfloat4 data_enc_lns = vfloat4::zero();

	if (rgb_lns || a_lns)
	{
		data_enc_lns = float16_to_float(lns_to_sf16(float_to_int(data_enc)));
	}

	blk.origin_texel = select(data_enc_unorm, data_enc_lns, lns_mask);

	// Store block metadata
	blk.data_min = data_min;
	blk.data_mean = data_mean;
	blk.data_max = data_max;
	blk.grayscale = all(grayscalev);
}